

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  undefined1 auVar24 [16];
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong unaff_RBX;
  size_t mask;
  undefined4 uVar28;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar46;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  undefined1 auVar44 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar54 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar55 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar58 [16];
  float fVar56;
  float fVar72;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar57;
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar73;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar67;
  float fVar69;
  undefined1 auVar66 [64];
  undefined1 auVar75 [16];
  float fVar74;
  float fVar87;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar88;
  float fVar89;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar99;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  undefined1 auVar94 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar120;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar128;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  undefined1 auVar135 [16];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar140 [16];
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [16];
  float fVar149;
  undefined1 auVar146 [16];
  float fVar150;
  float fVar153;
  float fVar154;
  undefined1 auVar151 [16];
  float fVar155;
  undefined1 auVar152 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  int local_157c;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  undefined8 local_1568;
  float fStack_1560;
  float fStack_155c;
  ulong local_1558;
  ulong local_1550;
  ulong local_1548;
  NodeRef *local_1540;
  ulong local_1538;
  ulong local_1530;
  ulong local_1528;
  ulong local_1520;
  Scene *local_1518;
  float fStack_1510;
  float fStack_150c;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      local_1540 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar4 = (ray->dir).field_0;
      auVar111 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx((undefined1  [16])aVar4,auVar36);
      auVar101._8_4_ = 0x219392ef;
      auVar101._0_8_ = 0x219392ef219392ef;
      auVar101._12_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar36,auVar101,1);
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar101 = vdivps_avx(auVar112,(undefined1  [16])aVar4);
      auVar102._8_4_ = 0x5d5e0b6b;
      auVar102._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar102._12_4_ = 0x5d5e0b6b;
      auVar36 = vblendvps_avx(auVar101,auVar102,auVar36);
      auVar90._0_4_ = auVar36._0_4_ * 0.99999964;
      auVar90._4_4_ = auVar36._4_4_ * 0.99999964;
      auVar90._8_4_ = auVar36._8_4_ * 0.99999964;
      auVar90._12_4_ = auVar36._12_4_ * 0.99999964;
      uVar28 = *(undefined4 *)&(ray->org).field_0;
      auVar118._4_4_ = uVar28;
      auVar118._0_4_ = uVar28;
      auVar118._8_4_ = uVar28;
      auVar118._12_4_ = uVar28;
      auVar118._16_4_ = uVar28;
      auVar118._20_4_ = uVar28;
      auVar118._24_4_ = uVar28;
      auVar118._28_4_ = uVar28;
      local_11f8 = *(float *)((long)&(ray->org).field_0 + 4);
      fStack_11f4 = local_11f8;
      fStack_11f0 = local_11f8;
      fStack_11ec = local_11f8;
      fStack_11e8 = local_11f8;
      fStack_11e4 = local_11f8;
      fStack_11e0 = local_11f8;
      fStack_11dc = local_11f8;
      local_1218 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      uStack_1214 = local_1218;
      uStack_1210 = local_1218;
      uStack_120c = local_1218;
      uStack_1208 = local_1218;
      uStack_1204 = local_1218;
      uStack_1200 = local_1218;
      uStack_11fc = local_1218;
      auVar103._0_4_ = auVar36._0_4_ * 1.0000004;
      auVar103._4_4_ = auVar36._4_4_ * 1.0000004;
      auVar103._8_4_ = auVar36._8_4_ * 1.0000004;
      auVar103._12_4_ = auVar36._12_4_ * 1.0000004;
      auVar36 = vshufps_avx(auVar90,auVar90,0);
      register0x000012d0 = auVar36;
      _local_1238 = auVar36;
      auVar36 = vmovshdup_avx(auVar90);
      auVar101 = vshufps_avx(auVar90,auVar90,0x55);
      register0x000012d0 = auVar101;
      _local_1258 = auVar101;
      auVar101 = vshufpd_avx(auVar90,auVar90,1);
      auVar112 = vshufps_avx(auVar90,auVar90,0xaa);
      register0x00001310 = auVar112;
      _local_1278 = auVar112;
      auVar112 = vshufps_avx(auVar103,auVar103,0);
      register0x00001310 = auVar112;
      _local_1298 = auVar112;
      local_1548 = (ulong)(auVar90._0_4_ < 0.0) << 5;
      auVar112 = vshufps_avx(auVar103,auVar103,0x55);
      register0x00001310 = auVar112;
      _local_12b8 = auVar112;
      auVar112 = vshufps_avx(auVar103,auVar103,0xaa);
      register0x00001310 = auVar112;
      _local_12d8 = auVar112;
      local_1550 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
      local_1558 = (ulong)(auVar101._0_4_ < 0.0) << 5 | 0x80;
      uVar33 = local_1548 ^ 0x20;
      uVar34 = local_1550 ^ 0x20;
      uVar32 = local_1558 ^ 0x20;
      auVar36 = vshufps_avx(auVar111,auVar111,0);
      local_12f8._16_16_ = auVar36;
      local_12f8._0_16_ = auVar36;
      auVar55 = ZEXT3264(local_12f8);
      auVar36 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_1318._16_16_ = auVar36;
      local_1318._0_16_ = auVar36;
      local_1538 = uVar32;
      local_1530 = uVar34;
      local_1528 = uVar33;
      do {
        if (local_1540 == stack) {
          return;
        }
        sVar30 = local_1540[-1].ptr;
        local_1540 = local_1540 + -1;
        do {
          if ((sVar30 & 8) == 0) {
            uVar25 = sVar30 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar44._4_4_ = fVar3;
            auVar44._0_4_ = fVar3;
            auVar44._8_4_ = fVar3;
            auVar44._12_4_ = fVar3;
            auVar44._16_4_ = fVar3;
            auVar44._20_4_ = fVar3;
            auVar44._24_4_ = fVar3;
            auVar44._28_4_ = fVar3;
            pfVar2 = (float *)(uVar25 + 0x100 + local_1548);
            pfVar1 = (float *)(uVar25 + 0x40 + local_1548);
            auVar54._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar54._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar54._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar54._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar54._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar54._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar54._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar54._28_4_ = auVar55._28_4_ + pfVar1[7];
            auVar54 = vsubps_avx(auVar54,auVar118);
            auVar15._4_4_ = auVar54._4_4_ * (float)local_1238._4_4_;
            auVar15._0_4_ = auVar54._0_4_ * (float)local_1238._0_4_;
            auVar15._8_4_ = auVar54._8_4_ * fStack_1230;
            auVar15._12_4_ = auVar54._12_4_ * fStack_122c;
            auVar15._16_4_ = auVar54._16_4_ * fStack_1228;
            auVar15._20_4_ = auVar54._20_4_ * fStack_1224;
            auVar15._24_4_ = auVar54._24_4_ * fStack_1220;
            auVar15._28_4_ = auVar54._28_4_;
            pfVar2 = (float *)(uVar25 + 0x100 + local_1550);
            pfVar1 = (float *)(uVar25 + 0x40 + local_1550);
            auVar64._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar64._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar64._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar64._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar64._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar64._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar64._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar64._28_4_ = auVar66._28_4_ + pfVar1[7];
            auVar54 = vmaxps_avx(local_12f8,auVar15);
            auVar22._4_4_ = fStack_11f4;
            auVar22._0_4_ = local_11f8;
            auVar22._8_4_ = fStack_11f0;
            auVar22._12_4_ = fStack_11ec;
            auVar22._16_4_ = fStack_11e8;
            auVar22._20_4_ = fStack_11e4;
            auVar22._24_4_ = fStack_11e0;
            auVar22._28_4_ = fStack_11dc;
            auVar15 = vsubps_avx(auVar64,auVar22);
            pfVar2 = (float *)(uVar25 + 0x100 + local_1558);
            auVar17._4_4_ = auVar15._4_4_ * (float)local_1258._4_4_;
            auVar17._0_4_ = auVar15._0_4_ * (float)local_1258._0_4_;
            auVar17._8_4_ = auVar15._8_4_ * fStack_1250;
            auVar17._12_4_ = auVar15._12_4_ * fStack_124c;
            auVar17._16_4_ = auVar15._16_4_ * fStack_1248;
            auVar17._20_4_ = auVar15._20_4_ * fStack_1244;
            auVar17._24_4_ = auVar15._24_4_ * fStack_1240;
            auVar17._28_4_ = auVar15._28_4_;
            pfVar1 = (float *)(uVar25 + 0x40 + local_1558);
            auVar83._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar83._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar83._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar83._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar83._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar83._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar83._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar83._28_4_ = local_12f8._28_4_ + pfVar1[7];
            auVar21._4_4_ = uStack_1214;
            auVar21._0_4_ = local_1218;
            auVar21._8_4_ = uStack_1210;
            auVar21._12_4_ = uStack_120c;
            auVar21._16_4_ = uStack_1208;
            auVar21._20_4_ = uStack_1204;
            auVar21._24_4_ = uStack_1200;
            auVar21._28_4_ = uStack_11fc;
            auVar16 = vsubps_avx(auVar83,auVar21);
            auVar18._4_4_ = auVar16._4_4_ * (float)local_1278._4_4_;
            auVar18._0_4_ = auVar16._0_4_ * (float)local_1278._0_4_;
            auVar18._8_4_ = auVar16._8_4_ * fStack_1270;
            auVar18._12_4_ = auVar16._12_4_ * fStack_126c;
            auVar18._16_4_ = auVar16._16_4_ * fStack_1268;
            auVar18._20_4_ = auVar16._20_4_ * fStack_1264;
            auVar18._24_4_ = auVar16._24_4_ * fStack_1260;
            auVar18._28_4_ = auVar16._28_4_;
            auVar15 = vmaxps_avx(auVar17,auVar18);
            pfVar2 = (float *)(uVar25 + 0x100 + uVar33);
            auVar54 = vmaxps_avx(auVar54,auVar15);
            pfVar1 = (float *)(uVar25 + 0x40 + uVar33);
            auVar65._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar65._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar65._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar65._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar65._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar65._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar65._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar65._28_4_ = auVar16._28_4_ + pfVar1[7];
            auVar15 = vsubps_avx(auVar65,auVar118);
            auVar16._4_4_ = auVar15._4_4_ * (float)local_1298._4_4_;
            auVar16._0_4_ = auVar15._0_4_ * (float)local_1298._0_4_;
            auVar16._8_4_ = auVar15._8_4_ * fStack_1290;
            auVar16._12_4_ = auVar15._12_4_ * fStack_128c;
            auVar16._16_4_ = auVar15._16_4_ * fStack_1288;
            auVar16._20_4_ = auVar15._20_4_ * fStack_1284;
            auVar16._24_4_ = auVar15._24_4_ * fStack_1280;
            auVar16._28_4_ = auVar15._28_4_;
            auVar15 = vminps_avx(local_1318,auVar16);
            pfVar2 = (float *)(uVar25 + 0x100 + uVar34);
            pfVar1 = (float *)(uVar25 + 0x40 + uVar34);
            auVar84._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar84._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar84._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar84._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar84._28_4_ = local_1318._28_4_ + pfVar1[7];
            auVar16 = vsubps_avx(auVar84,auVar22);
            auVar19._4_4_ = auVar16._4_4_ * (float)local_12b8._4_4_;
            auVar19._0_4_ = auVar16._0_4_ * (float)local_12b8._0_4_;
            auVar19._8_4_ = auVar16._8_4_ * fStack_12b0;
            auVar19._12_4_ = auVar16._12_4_ * fStack_12ac;
            auVar19._16_4_ = auVar16._16_4_ * fStack_12a8;
            auVar19._20_4_ = auVar16._20_4_ * fStack_12a4;
            auVar19._24_4_ = auVar16._24_4_ * fStack_12a0;
            auVar19._28_4_ = auVar16._28_4_;
            pfVar2 = (float *)(uVar25 + 0x100 + uVar32);
            pfVar1 = (float *)(uVar25 + 0x40 + uVar32);
            auVar94._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar94._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar94._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar94._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar94._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar94._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar94._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar94._28_4_ = fStack_11dc + pfVar1[7];
            auVar16 = vsubps_avx(auVar94,auVar21);
            auVar20._4_4_ = auVar16._4_4_ * (float)local_12d8._4_4_;
            auVar20._0_4_ = auVar16._0_4_ * (float)local_12d8._0_4_;
            auVar20._8_4_ = auVar16._8_4_ * fStack_12d0;
            auVar20._12_4_ = auVar16._12_4_ * fStack_12cc;
            auVar20._16_4_ = auVar16._16_4_ * fStack_12c8;
            auVar20._20_4_ = auVar16._20_4_ * fStack_12c4;
            auVar20._24_4_ = auVar16._24_4_ * fStack_12c0;
            auVar20._28_4_ = auVar16._28_4_;
            auVar16 = vminps_avx(auVar19,auVar20);
            auVar15 = vminps_avx(auVar15,auVar16);
            auVar54 = vcmpps_avx(auVar54,auVar15,2);
            auVar55 = ZEXT3264(auVar54);
            if (((uint)sVar30 & 7) == 6) {
              auVar15 = vcmpps_avx(*(undefined1 (*) [32])(uVar25 + 0x1c0),auVar44,2);
              auVar16 = vcmpps_avx(auVar44,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
              auVar16 = vandps_avx(auVar15,auVar16);
              auVar54 = vandps_avx(auVar16,auVar54);
              auVar55 = ZEXT1664(auVar54._16_16_);
              auVar36 = vpackssdw_avx(auVar54._0_16_,auVar54._16_16_);
            }
            else {
              auVar36 = vpackssdw_avx(auVar54._0_16_,auVar54._16_16_);
            }
            auVar66 = ZEXT3264(auVar15);
            auVar36 = vpsllw_avx(auVar36,0xf);
            auVar36 = vpacksswb_avx(auVar36,auVar36);
            unaff_RBX = (ulong)(byte)(SUB161(auVar36 >> 7,0) & 1 |
                                      (SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar36 >> 0x3f,0) << 7);
          }
          if ((sVar30 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar27 = 4;
            }
            else {
              uVar25 = sVar30 & 0xfffffffffffffff0;
              lVar26 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              iVar27 = 0;
              sVar30 = *(size_t *)(uVar25 + lVar26 * 8);
              uVar29 = unaff_RBX - 1 & unaff_RBX;
              if (uVar29 != 0) {
                local_1540->ptr = sVar30;
                lVar26 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                  }
                }
                uVar31 = uVar29 - 1;
                while( true ) {
                  local_1540 = local_1540 + 1;
                  sVar30 = *(size_t *)(uVar25 + lVar26 * 8);
                  uVar31 = uVar31 & uVar29;
                  if (uVar31 == 0) break;
                  local_1540->ptr = sVar30;
                  lVar26 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                    }
                  }
                  uVar29 = uVar31 - 1;
                }
                iVar27 = 0;
              }
            }
          }
          else {
            iVar27 = 6;
          }
        } while (iVar27 == 0);
        if (iVar27 == 6) {
          iVar27 = 0;
          uVar25 = (ulong)((uint)sVar30 & 0xf) - 8;
          bVar35 = uVar25 != 0;
          if (bVar35) {
            uVar31 = sVar30 & 0xfffffffffffffff0;
            uVar29 = 0;
            do {
              lVar26 = uVar29 * 0x140;
              fVar3 = (ray->dir).field_0.m128[3];
              pfVar2 = (float *)(uVar31 + 0x90 + lVar26);
              pfVar1 = (float *)(uVar31 + lVar26);
              auVar111._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar111._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar111._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar111._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xa0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x10 + lVar26);
              auVar58._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar58._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar58._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar58._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xb0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x20 + lVar26);
              auVar135._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar135._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar135._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar135._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xc0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x30 + lVar26);
              auVar91._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar91._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar91._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar91._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xd0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x40 + lVar26);
              auVar104._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar104._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar104._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar104._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xe0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x50 + lVar26);
              auVar140._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar140._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar140._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar140._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0xf0 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x60 + lVar26);
              auVar121._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar121._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar121._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar121._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar31 + 0x100 + lVar26);
              pfVar1 = (float *)(uVar31 + 0x70 + lVar26);
              auVar129._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar129._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar129._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar129._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar1 = (float *)(uVar31 + 0x110 + lVar26);
              pfVar2 = (float *)(uVar31 + 0x80 + lVar26);
              auVar37._0_4_ = fVar3 * *pfVar1 + *pfVar2;
              auVar37._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
              auVar37._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
              auVar37._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
              uVar28 = *(undefined4 *)&(ray->org).field_0;
              auVar133._4_4_ = uVar28;
              auVar133._0_4_ = uVar28;
              auVar133._8_4_ = uVar28;
              auVar133._12_4_ = uVar28;
              uVar28 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar145._4_4_ = uVar28;
              auVar145._0_4_ = uVar28;
              auVar145._8_4_ = uVar28;
              auVar145._12_4_ = uVar28;
              uVar28 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar151._4_4_ = uVar28;
              auVar151._0_4_ = uVar28;
              auVar151._8_4_ = uVar28;
              auVar151._12_4_ = uVar28;
              local_14f8 = vsubps_avx(auVar111,auVar133);
              local_1508 = vsubps_avx(auVar58,auVar145);
              auVar36 = vsubps_avx(auVar135,auVar151);
              auVar101 = vsubps_avx(auVar91,auVar133);
              auVar111 = vsubps_avx(auVar104,auVar145);
              auVar112 = vsubps_avx(auVar140,auVar151);
              auVar90 = vsubps_avx(auVar121,auVar133);
              auVar102 = vsubps_avx(auVar129,auVar145);
              auVar103 = vsubps_avx(auVar37,auVar151);
              auVar37 = vsubps_avx(auVar90,local_14f8);
              auVar39 = vsubps_avx(auVar102,local_1508);
              auVar38 = vsubps_avx(auVar103,auVar36);
              fVar3 = local_1508._0_4_;
              fVar56 = auVar102._0_4_ + fVar3;
              fVar9 = local_1508._4_4_;
              fVar67 = auVar102._4_4_ + fVar9;
              fVar73 = local_1508._8_4_;
              fVar69 = auVar102._8_4_ + fVar73;
              fVar12 = local_1508._12_4_;
              fVar72 = auVar102._12_4_ + fVar12;
              fVar7 = auVar36._0_4_;
              fVar88 = auVar103._0_4_ + fVar7;
              fVar68 = auVar36._4_4_;
              fVar95 = auVar103._4_4_ + fVar68;
              fVar10 = auVar36._8_4_;
              fVar97 = auVar103._8_4_ + fVar10;
              fVar13 = auVar36._12_4_;
              fVar99 = auVar103._12_4_ + fVar13;
              fVar57 = auVar38._0_4_;
              auVar122._0_4_ = fVar57 * fVar56;
              fVar70 = auVar38._4_4_;
              auVar122._4_4_ = fVar70 * fVar67;
              fVar45 = auVar38._8_4_;
              auVar122._8_4_ = fVar45 * fVar69;
              fVar46 = auVar38._12_4_;
              auVar122._12_4_ = fVar46 * fVar72;
              fVar156 = auVar39._0_4_;
              auVar130._0_4_ = fVar156 * fVar88;
              fVar157 = auVar39._4_4_;
              auVar130._4_4_ = fVar157 * fVar95;
              fVar158 = auVar39._8_4_;
              auVar130._8_4_ = fVar158 * fVar97;
              fVar159 = auVar39._12_4_;
              auVar130._12_4_ = fVar159 * fVar99;
              auVar39 = vsubps_avx(auVar130,auVar122);
              fVar8 = local_14f8._0_4_;
              fVar119 = auVar90._0_4_ + fVar8;
              fVar71 = local_14f8._4_4_;
              fVar126 = auVar90._4_4_ + fVar71;
              fVar11 = local_14f8._8_4_;
              fVar127 = auVar90._8_4_ + fVar11;
              fVar14 = local_14f8._12_4_;
              fVar128 = auVar90._12_4_ + fVar14;
              fVar150 = auVar37._0_4_;
              auVar92._0_4_ = fVar150 * fVar88;
              fVar153 = auVar37._4_4_;
              auVar92._4_4_ = fVar153 * fVar95;
              fVar154 = auVar37._8_4_;
              auVar92._8_4_ = fVar154 * fVar97;
              fVar155 = auVar37._12_4_;
              auVar92._12_4_ = fVar155 * fVar99;
              auVar131._0_4_ = fVar119 * fVar57;
              auVar131._4_4_ = fVar126 * fVar70;
              auVar131._8_4_ = fVar127 * fVar45;
              auVar131._12_4_ = fVar128 * fVar46;
              auVar37 = vsubps_avx(auVar131,auVar92);
              auVar123._0_4_ = fVar156 * fVar119;
              auVar123._4_4_ = fVar157 * fVar126;
              auVar123._8_4_ = fVar158 * fVar127;
              auVar123._12_4_ = fVar159 * fVar128;
              auVar38._0_4_ = fVar150 * fVar56;
              auVar38._4_4_ = fVar153 * fVar67;
              auVar38._8_4_ = fVar154 * fVar69;
              auVar38._12_4_ = fVar155 * fVar72;
              auVar38 = vsubps_avx(auVar38,auVar123);
              fStack_1574 = (ray->dir).field_0.m128[2];
              local_1568._4_4_ = (ray->dir).field_0.m128[1];
              fStack_1510 = (ray->dir).field_0.m128[0];
              auVar132._0_4_ =
                   auVar39._0_4_ * fStack_1510 +
                   local_1568._4_4_ * auVar37._0_4_ + fStack_1574 * auVar38._0_4_;
              auVar132._4_4_ =
                   auVar39._4_4_ * fStack_1510 +
                   local_1568._4_4_ * auVar37._4_4_ + fStack_1574 * auVar38._4_4_;
              auVar132._8_4_ =
                   auVar39._8_4_ * fStack_1510 +
                   local_1568._4_4_ * auVar37._8_4_ + fStack_1574 * auVar38._8_4_;
              auVar132._12_4_ =
                   auVar39._12_4_ * fStack_1510 +
                   local_1568._4_4_ * auVar37._12_4_ + fStack_1574 * auVar38._12_4_;
              auVar37 = vsubps_avx(local_1508,auVar111);
              auVar36 = vsubps_avx(auVar36,auVar112);
              fVar56 = fVar3 + auVar111._0_4_;
              fVar67 = fVar9 + auVar111._4_4_;
              fVar69 = fVar73 + auVar111._8_4_;
              fVar72 = fVar12 + auVar111._12_4_;
              fVar95 = auVar112._0_4_ + fVar7;
              fVar99 = auVar112._4_4_ + fVar68;
              fVar126 = auVar112._8_4_ + fVar10;
              fVar128 = auVar112._12_4_ + fVar13;
              fVar134 = auVar36._0_4_;
              auVar152._0_4_ = fVar134 * fVar56;
              fVar136 = auVar36._4_4_;
              auVar152._4_4_ = fVar136 * fVar67;
              fVar137 = auVar36._8_4_;
              auVar152._8_4_ = fVar137 * fVar69;
              fVar138 = auVar36._12_4_;
              auVar152._12_4_ = fVar138 * fVar72;
              fVar88 = auVar37._0_4_;
              auVar75._0_4_ = fVar88 * fVar95;
              fVar97 = auVar37._4_4_;
              auVar75._4_4_ = fVar97 * fVar99;
              fVar119 = auVar37._8_4_;
              auVar75._8_4_ = fVar119 * fVar126;
              fVar127 = auVar37._12_4_;
              auVar75._12_4_ = fVar127 * fVar128;
              auVar36 = vsubps_avx(auVar75,auVar152);
              auVar37 = vsubps_avx(local_14f8,auVar101);
              fVar144 = auVar37._0_4_;
              auVar93._0_4_ = fVar144 * fVar95;
              fVar147 = auVar37._4_4_;
              auVar93._4_4_ = fVar147 * fVar99;
              fVar148 = auVar37._8_4_;
              auVar93._8_4_ = fVar148 * fVar126;
              fVar149 = auVar37._12_4_;
              auVar93._12_4_ = fVar149 * fVar128;
              fVar95 = auVar101._0_4_ + fVar8;
              fVar99 = auVar101._4_4_ + fVar71;
              fVar126 = auVar101._8_4_ + fVar11;
              fVar128 = auVar101._12_4_ + fVar14;
              auVar124._0_4_ = fVar134 * fVar95;
              auVar124._4_4_ = fVar136 * fVar99;
              auVar124._8_4_ = fVar137 * fVar126;
              auVar124._12_4_ = fVar138 * fVar128;
              auVar37 = vsubps_avx(auVar124,auVar93);
              auVar113._0_4_ = fVar88 * fVar95;
              auVar113._4_4_ = fVar97 * fVar99;
              auVar113._8_4_ = fVar119 * fVar126;
              auVar113._12_4_ = fVar127 * fVar128;
              auVar39._0_4_ = fVar144 * fVar56;
              auVar39._4_4_ = fVar147 * fVar67;
              auVar39._8_4_ = fVar148 * fVar69;
              auVar39._12_4_ = fVar149 * fVar72;
              auVar39 = vsubps_avx(auVar39,auVar113);
              auVar40._0_4_ =
                   fStack_1510 * auVar36._0_4_ +
                   local_1568._4_4_ * auVar37._0_4_ + fStack_1574 * auVar39._0_4_;
              auVar40._4_4_ =
                   fStack_1510 * auVar36._4_4_ +
                   local_1568._4_4_ * auVar37._4_4_ + fStack_1574 * auVar39._4_4_;
              auVar40._8_4_ =
                   fStack_1510 * auVar36._8_4_ +
                   local_1568._4_4_ * auVar37._8_4_ + fStack_1574 * auVar39._8_4_;
              auVar40._12_4_ =
                   fStack_1510 * auVar36._12_4_ +
                   local_1568._4_4_ * auVar37._12_4_ + fStack_1574 * auVar39._12_4_;
              auVar36 = vsubps_avx(auVar101,auVar90);
              fVar74 = auVar101._0_4_ + auVar90._0_4_;
              fVar85 = auVar101._4_4_ + auVar90._4_4_;
              fVar86 = auVar101._8_4_ + auVar90._8_4_;
              fVar87 = auVar101._12_4_ + auVar90._12_4_;
              auVar101 = vsubps_avx(auVar111,auVar102);
              fVar95 = auVar111._0_4_ + auVar102._0_4_;
              fVar99 = auVar111._4_4_ + auVar102._4_4_;
              fVar126 = auVar111._8_4_ + auVar102._8_4_;
              fVar128 = auVar111._12_4_ + auVar102._12_4_;
              auVar111 = vsubps_avx(auVar112,auVar103);
              fVar56 = auVar112._0_4_ + auVar103._0_4_;
              fVar67 = auVar112._4_4_ + auVar103._4_4_;
              fVar69 = auVar112._8_4_ + auVar103._8_4_;
              fVar72 = auVar112._12_4_ + auVar103._12_4_;
              fVar89 = auVar111._0_4_;
              auVar105._0_4_ = fVar89 * fVar95;
              fVar96 = auVar111._4_4_;
              auVar105._4_4_ = fVar96 * fVar99;
              fVar98 = auVar111._8_4_;
              auVar105._8_4_ = fVar98 * fVar126;
              fVar100 = auVar111._12_4_;
              auVar105._12_4_ = fVar100 * fVar128;
              fVar139 = auVar101._0_4_;
              auVar114._0_4_ = fVar139 * fVar56;
              fVar141 = auVar101._4_4_;
              auVar114._4_4_ = fVar141 * fVar67;
              fVar142 = auVar101._8_4_;
              auVar114._8_4_ = fVar142 * fVar69;
              fVar143 = auVar101._12_4_;
              auVar114._12_4_ = fVar143 * fVar72;
              auVar101 = vsubps_avx(auVar114,auVar105);
              fVar120 = auVar36._0_4_;
              auVar47._0_4_ = fVar120 * fVar56;
              fVar56 = auVar36._4_4_;
              auVar47._4_4_ = fVar56 * fVar67;
              fVar67 = auVar36._8_4_;
              auVar47._8_4_ = fVar67 * fVar69;
              fVar69 = auVar36._12_4_;
              auVar47._12_4_ = fVar69 * fVar72;
              auVar115._0_4_ = fVar89 * fVar74;
              auVar115._4_4_ = fVar96 * fVar85;
              auVar115._8_4_ = fVar98 * fVar86;
              auVar115._12_4_ = fVar100 * fVar87;
              auVar36 = vsubps_avx(auVar115,auVar47);
              auVar76._0_4_ = fVar139 * fVar74;
              auVar76._4_4_ = fVar141 * fVar85;
              auVar76._8_4_ = fVar142 * fVar86;
              auVar76._12_4_ = fVar143 * fVar87;
              auVar59._0_4_ = fVar120 * fVar95;
              auVar59._4_4_ = fVar56 * fVar99;
              auVar59._8_4_ = fVar67 * fVar126;
              auVar59._12_4_ = fVar69 * fVar128;
              auVar111 = vsubps_avx(auVar59,auVar76);
              local_1578 = fStack_1574;
              fStack_1570 = fStack_1574;
              fStack_156c = fStack_1574;
              local_1568._0_4_ = local_1568._4_4_;
              fStack_1560 = local_1568._4_4_;
              fStack_155c = local_1568._4_4_;
              auVar48._0_4_ =
                   fStack_1510 * auVar101._0_4_ +
                   local_1568._4_4_ * auVar36._0_4_ + fStack_1574 * auVar111._0_4_;
              auVar48._4_4_ =
                   fStack_1510 * auVar101._4_4_ +
                   local_1568._4_4_ * auVar36._4_4_ + fStack_1574 * auVar111._4_4_;
              auVar48._8_4_ =
                   fStack_1510 * auVar101._8_4_ +
                   local_1568._4_4_ * auVar36._8_4_ + fStack_1574 * auVar111._8_4_;
              auVar48._12_4_ =
                   fStack_1510 * auVar101._12_4_ +
                   local_1568._4_4_ * auVar36._12_4_ + fStack_1574 * auVar111._12_4_;
              auVar146._0_4_ = auVar48._0_4_ + auVar132._0_4_ + auVar40._0_4_;
              auVar146._4_4_ = auVar48._4_4_ + auVar132._4_4_ + auVar40._4_4_;
              auVar146._8_4_ = auVar48._8_4_ + auVar132._8_4_ + auVar40._8_4_;
              auVar146._12_4_ = auVar48._12_4_ + auVar132._12_4_ + auVar40._12_4_;
              auVar36 = vminps_avx(auVar132,auVar40);
              auVar101 = vminps_avx(auVar36,auVar48);
              auVar77._8_4_ = 0x7fffffff;
              auVar77._0_8_ = 0x7fffffff7fffffff;
              auVar77._12_4_ = 0x7fffffff;
              auVar36 = vandps_avx(auVar146,auVar77);
              auVar78._0_4_ = auVar36._0_4_ * 1.1920929e-07;
              auVar78._4_4_ = auVar36._4_4_ * 1.1920929e-07;
              auVar78._8_4_ = auVar36._8_4_ * 1.1920929e-07;
              auVar78._12_4_ = auVar36._12_4_ * 1.1920929e-07;
              uVar32 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
              auVar106._0_8_ = uVar32 ^ 0x8000000080000000;
              auVar106._8_4_ = -auVar78._8_4_;
              auVar106._12_4_ = -auVar78._12_4_;
              auVar101 = vcmpps_avx(auVar101,auVar106,5);
              auVar66 = ZEXT1664(auVar101);
              auVar111 = vmaxps_avx(auVar132,auVar40);
              auVar111 = vmaxps_avx(auVar111,auVar48);
              auVar111 = vcmpps_avx(auVar111,auVar78,2);
              auVar55 = ZEXT1664(auVar111);
              auVar101 = vorps_avx(auVar101,auVar111);
              auVar111 = auVar24 & auVar101;
              if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar111[0xf] < '\0') {
                auVar49._0_4_ = fVar88 * fVar57;
                auVar49._4_4_ = fVar97 * fVar70;
                auVar49._8_4_ = fVar119 * fVar45;
                auVar49._12_4_ = fVar127 * fVar46;
                auVar60._0_4_ = fVar156 * fVar134;
                auVar60._4_4_ = fVar157 * fVar136;
                auVar60._8_4_ = fVar158 * fVar137;
                auVar60._12_4_ = fVar159 * fVar138;
                auVar90 = vsubps_avx(auVar60,auVar49);
                auVar79._0_4_ = fVar134 * fVar139;
                auVar79._4_4_ = fVar136 * fVar141;
                auVar79._8_4_ = fVar137 * fVar142;
                auVar79._12_4_ = fVar138 * fVar143;
                auVar107._0_4_ = fVar88 * fVar89;
                auVar107._4_4_ = fVar97 * fVar96;
                auVar107._8_4_ = fVar119 * fVar98;
                auVar107._12_4_ = fVar127 * fVar100;
                auVar102 = vsubps_avx(auVar107,auVar79);
                auVar111 = vandps_avx(auVar77,auVar49);
                auVar112 = vandps_avx(auVar77,auVar79);
                auVar111 = vcmpps_avx(auVar111,auVar112,1);
                local_1348 = vblendvps_avx(auVar102,auVar90,auVar111);
                auVar50._0_4_ = fVar144 * fVar89;
                auVar50._4_4_ = fVar147 * fVar96;
                auVar50._8_4_ = fVar148 * fVar98;
                auVar50._12_4_ = fVar149 * fVar100;
                auVar61._0_4_ = fVar144 * fVar57;
                auVar61._4_4_ = fVar147 * fVar70;
                auVar61._8_4_ = fVar148 * fVar45;
                auVar61._12_4_ = fVar149 * fVar46;
                auVar80._0_4_ = fVar134 * fVar150;
                auVar80._4_4_ = fVar136 * fVar153;
                auVar80._8_4_ = fVar137 * fVar154;
                auVar80._12_4_ = fVar138 * fVar155;
                auVar90 = vsubps_avx(auVar61,auVar80);
                auVar108._0_4_ = fVar134 * fVar120;
                auVar108._4_4_ = fVar136 * fVar56;
                auVar108._8_4_ = fVar137 * fVar67;
                auVar108._12_4_ = fVar138 * fVar69;
                auVar102 = vsubps_avx(auVar108,auVar50);
                auVar111 = vandps_avx(auVar77,auVar80);
                auVar112 = vandps_avx(auVar77,auVar50);
                auVar111 = vcmpps_avx(auVar111,auVar112,1);
                local_1338 = vblendvps_avx(auVar102,auVar90,auVar111);
                auVar55 = ZEXT1664(local_1338);
                auVar41._0_4_ = fVar88 * fVar120;
                auVar41._4_4_ = fVar97 * fVar56;
                auVar41._8_4_ = fVar119 * fVar67;
                auVar41._12_4_ = fVar127 * fVar69;
                auVar62._0_4_ = fVar88 * fVar150;
                auVar62._4_4_ = fVar97 * fVar153;
                auVar62._8_4_ = fVar119 * fVar154;
                auVar62._12_4_ = fVar127 * fVar155;
                auVar81._0_4_ = fVar156 * fVar144;
                auVar81._4_4_ = fVar157 * fVar147;
                auVar81._8_4_ = fVar158 * fVar148;
                auVar81._12_4_ = fVar159 * fVar149;
                auVar109._0_4_ = fVar144 * fVar139;
                auVar109._4_4_ = fVar147 * fVar141;
                auVar109._8_4_ = fVar148 * fVar142;
                auVar109._12_4_ = fVar149 * fVar143;
                auVar90 = vsubps_avx(auVar62,auVar81);
                auVar102 = vsubps_avx(auVar109,auVar41);
                auVar111 = vandps_avx(auVar77,auVar81);
                auVar112 = vandps_avx(auVar77,auVar41);
                auVar111 = vcmpps_avx(auVar111,auVar112,1);
                local_1328 = vblendvps_avx(auVar102,auVar90,auVar111);
                fVar57 = local_1348._0_4_ * fStack_1510 +
                         local_1338._0_4_ * local_1568._4_4_ + local_1328._0_4_ * fStack_1574;
                fVar56 = local_1348._4_4_ * fStack_1510 +
                         local_1338._4_4_ * local_1568._4_4_ + local_1328._4_4_ * fStack_1574;
                fVar70 = local_1348._8_4_ * fStack_1510 +
                         local_1338._8_4_ * local_1568._4_4_ + local_1328._8_4_ * fStack_1574;
                fVar67 = local_1348._12_4_ * fStack_1510 +
                         local_1338._12_4_ * local_1568._4_4_ + local_1328._12_4_ * fStack_1574;
                auVar82._0_4_ = fVar57 + fVar57;
                auVar82._4_4_ = fVar56 + fVar56;
                auVar82._8_4_ = fVar70 + fVar70;
                auVar82._12_4_ = fVar67 + fVar67;
                fVar57 = local_1348._0_4_ * fVar8 +
                         local_1338._0_4_ * fVar3 + local_1328._0_4_ * fVar7;
                fVar68 = local_1348._4_4_ * fVar71 +
                         local_1338._4_4_ * fVar9 + local_1328._4_4_ * fVar68;
                fVar71 = local_1348._8_4_ * fVar11 +
                         local_1338._8_4_ * fVar73 + local_1328._8_4_ * fVar10;
                fVar73 = local_1348._12_4_ * fVar14 +
                         local_1338._12_4_ * fVar12 + local_1328._12_4_ * fVar13;
                auVar111 = vrcpps_avx(auVar82);
                fVar3 = auVar111._0_4_;
                auVar116._0_4_ = auVar82._0_4_ * fVar3;
                fVar7 = auVar111._4_4_;
                auVar116._4_4_ = auVar82._4_4_ * fVar7;
                fVar8 = auVar111._8_4_;
                auVar116._8_4_ = auVar82._8_4_ * fVar8;
                fVar9 = auVar111._12_4_;
                auVar116._12_4_ = auVar82._12_4_ * fVar9;
                auVar125._8_4_ = 0x3f800000;
                auVar125._0_8_ = &DAT_3f8000003f800000;
                auVar125._12_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar125,auVar116);
                local_1358._0_4_ = (fVar57 + fVar57) * (fVar3 + fVar3 * auVar111._0_4_);
                local_1358._4_4_ = (fVar68 + fVar68) * (fVar7 + fVar7 * auVar111._4_4_);
                local_1358._8_4_ = (fVar71 + fVar71) * (fVar8 + fVar8 * auVar111._8_4_);
                local_1358._12_4_ = (fVar73 + fVar73) * (fVar9 + fVar9 * auVar111._12_4_);
                auVar66 = ZEXT1664(local_1358);
                uVar28 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar110._4_4_ = uVar28;
                auVar110._0_4_ = uVar28;
                auVar110._8_4_ = uVar28;
                auVar110._12_4_ = uVar28;
                auVar111 = vcmpps_avx(auVar110,local_1358,2);
                fVar3 = ray->tfar;
                auVar117._4_4_ = fVar3;
                auVar117._0_4_ = fVar3;
                auVar117._8_4_ = fVar3;
                auVar117._12_4_ = fVar3;
                auVar112 = vcmpps_avx(local_1358,auVar117,2);
                auVar111 = vandps_avx(auVar111,auVar112);
                auVar112 = vcmpps_avx(auVar82,_DAT_01feba10,4);
                auVar111 = vandps_avx(auVar112,auVar111);
                auVar101 = vandps_avx(auVar101,auVar24);
                auVar111 = vpslld_avx(auVar111,0x1f);
                auVar112 = vpsrad_avx(auVar111,0x1f);
                auVar111 = auVar101 & auVar112;
                if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar111[0xf] < '\0') {
                  auVar101 = vandps_avx(auVar112,auVar101);
                  local_1518 = context->scene;
                  auVar111 = vrcpps_avx(auVar146);
                  fVar3 = auVar111._0_4_;
                  auVar51._0_4_ = auVar146._0_4_ * fVar3;
                  fVar7 = auVar111._4_4_;
                  auVar51._4_4_ = auVar146._4_4_ * fVar7;
                  fVar8 = auVar111._8_4_;
                  auVar51._8_4_ = auVar146._8_4_ * fVar8;
                  fVar9 = auVar111._12_4_;
                  auVar51._12_4_ = auVar146._12_4_ * fVar9;
                  auVar63._8_4_ = 0x3f800000;
                  auVar63._0_8_ = &DAT_3f8000003f800000;
                  auVar63._12_4_ = 0x3f800000;
                  auVar66 = ZEXT1664(auVar63);
                  auVar111 = vsubps_avx(auVar63,auVar51);
                  auVar42._0_4_ = fVar3 + fVar3 * auVar111._0_4_;
                  auVar42._4_4_ = fVar7 + fVar7 * auVar111._4_4_;
                  auVar42._8_4_ = fVar8 + fVar8 * auVar111._8_4_;
                  auVar42._12_4_ = fVar9 + fVar9 * auVar111._12_4_;
                  auVar52._8_4_ = 0x219392ef;
                  auVar52._0_8_ = 0x219392ef219392ef;
                  auVar52._12_4_ = 0x219392ef;
                  auVar36 = vcmpps_avx(auVar36,auVar52,5);
                  auVar36 = vandps_avx(auVar36,auVar42);
                  auVar53._0_4_ = auVar132._0_4_ * auVar36._0_4_;
                  auVar53._4_4_ = auVar132._4_4_ * auVar36._4_4_;
                  auVar53._8_4_ = auVar132._8_4_ * auVar36._8_4_;
                  auVar53._12_4_ = auVar132._12_4_ * auVar36._12_4_;
                  local_1378 = vminps_avx(auVar53,auVar63);
                  auVar55 = ZEXT1664(local_1378);
                  auVar43._0_4_ = auVar40._0_4_ * auVar36._0_4_;
                  auVar43._4_4_ = auVar40._4_4_ * auVar36._4_4_;
                  auVar43._8_4_ = auVar40._8_4_ * auVar36._8_4_;
                  auVar43._12_4_ = auVar40._12_4_ * auVar36._12_4_;
                  local_1368 = vminps_avx(auVar43,auVar63);
                  uVar28 = vmovmskps_avx(auVar101);
                  uVar32 = CONCAT44((int)((ulong)stack >> 0x20),uVar28);
                  local_1520 = uVar29;
                  fStack_150c = fStack_1510;
                  do {
                    uVar33 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                      }
                    }
                    h.geomID = *(uint *)(lVar26 + uVar31 + 0x120 + uVar33 * 4);
                    pGVar5 = (local_1518->geometries).items[h.geomID].ptr;
                    if ((pGVar5->mask & ray->mask) == 0) {
                      uVar32 = uVar32 ^ 1L << (uVar33 & 0x3f);
                      bVar23 = true;
                    }
                    else {
                      pRVar6 = context->args;
                      if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar23 = false;
                        uVar29 = local_1520;
                      }
                      else {
                        local_1568 = uVar25;
                        h.u = *(float *)(local_1378 + uVar33 * 4);
                        h.v = *(float *)(local_1368 + uVar33 * 4);
                        auVar55 = ZEXT464((uint)h.v);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar26 + uVar31 + 0x130 + uVar33 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1348 + uVar33 * 4);
                        auVar66 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1338 + uVar33 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1328 + uVar33 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_1578 = ray->tfar;
                        ray->tfar = *(float *)(local_1358 + uVar33 * 4);
                        local_157c = -1;
                        args.valid = &local_157c;
                        args.geometryUserPtr = pGVar5->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030920b:
                          if (pRVar6->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar66 = ZEXT1664(auVar66._0_16_);
                              (*pRVar6->filter)(&args);
                              auVar55._8_56_ = extraout_var_00;
                              auVar55._0_8_ = extraout_XMM1_Qa_00;
                            }
                            if (*args.valid == 0) goto LAB_00309268;
                          }
                          bVar23 = false;
                        }
                        else {
                          local_14f8._0_8_ = context;
                          local_1508._0_8_ = ray;
                          auVar66 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                          (*pGVar5->occlusionFilterN)(&args);
                          auVar55._8_56_ = extraout_var;
                          auVar55._0_8_ = extraout_XMM1_Qa;
                          context = (RayQueryContext *)local_14f8._0_8_;
                          ray = (Ray *)local_1508._0_8_;
                          if (*args.valid != 0) goto LAB_0030920b;
LAB_00309268:
                          ray->tfar = local_1578;
                          uVar32 = uVar32 ^ 1L << (uVar33 & 0x3f);
                          bVar23 = true;
                        }
                        uVar25 = local_1568;
                        uVar29 = local_1520;
                      }
                    }
                    iVar27 = 0;
                    if (!bVar23) {
                      uVar32 = local_1538;
                      uVar33 = local_1528;
                      uVar34 = local_1530;
                      if (bVar35) {
                        ray->tfar = -INFINITY;
                        iVar27 = 3;
                      }
                      goto LAB_003092d5;
                    }
                  } while (uVar32 != 0);
                }
              }
              iVar27 = 0;
              uVar29 = uVar29 + 1;
              bVar35 = uVar29 < uVar25;
              uVar32 = local_1538;
              uVar33 = local_1528;
              uVar34 = local_1530;
            } while (uVar29 != uVar25);
          }
        }
LAB_003092d5:
      } while (iVar27 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }